

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

MSize var_lookup_(FuncState *fs,GCstr *name,ExpDesc *e,int first)

{
  byte bVar1;
  uint uVar2;
  MSize MVar3;
  FuncScope *pFVar4;
  ulong uVar5;
  MSize MVar6;
  ulong uVar7;
  uint uVar8;
  
  if (fs == (FuncState *)0x0) {
    e->k = VGLOBAL;
    e->t = 0xffffffff;
    e->f = 0xffffffff;
    (e->u).sval = name;
LAB_00120806:
    uVar2 = 0xffffffff;
  }
  else {
    uVar2 = fs->nactvar;
    uVar8 = uVar2;
    do {
      uVar8 = uVar8 - 1;
      uVar2 = uVar2 - 1;
      if ((int)uVar2 < 0) {
        MVar3 = var_lookup_(fs->prev,name,e,0);
        if ((int)MVar3 < 0) goto LAB_00120806;
        bVar1 = fs->nuv;
        uVar5 = (ulong)bVar1;
        uVar2 = (uint)bVar1;
        uVar7 = 0;
        goto LAB_001207ef;
      }
    } while ((GCstr *)fs->ls->vstack[*(ushort *)((long)fs->varmap + (ulong)(uVar8 * 2))].name.
                      gcptr64 != name);
    e->k = VLOCAL;
    e->t = 0xffffffff;
    (e->u).s.info = uVar2;
    e->f = 0xffffffff;
    if (first == 0) {
      pFVar4 = (FuncScope *)&fs->bl;
      do {
        pFVar4 = pFVar4->prev;
        if (pFVar4 == (FuncScope *)0x0) goto LAB_001207b1;
      } while (uVar2 < pFVar4->nactvar);
      pFVar4->flags = pFVar4->flags | 8;
    }
LAB_001207b1:
    uVar2 = (uint)fs->varmap[uVar8 & 0x7fffffff];
    *(uint *)((long)&e->u + 4) = (uint)fs->varmap[uVar8 & 0x7fffffff];
  }
  return uVar2;
LAB_001207ef:
  if (uVar5 == uVar7) {
    if (0x77 < bVar1) {
      err_limit(fs,0x78,"upvalues");
    }
    fs->uvmap[uVar5] = (VarIndex)MVar3;
    MVar6 = MVar3;
    if (e->k != VLOCAL) {
      MVar6 = (e->u).s.info - 0x78;
    }
    fs->uvtmp[uVar5] = (VarIndex)MVar6;
    fs->nuv = bVar1 + 1;
LAB_0012083a:
    (e->u).s.info = uVar2 & 0xff;
    e->k = VUPVAL;
    return MVar3;
  }
  if (MVar3 == fs->uvmap[uVar7]) {
    uVar2 = (uint)uVar7;
    goto LAB_0012083a;
  }
  uVar7 = uVar7 + 1;
  goto LAB_001207ef;
}

Assistant:

static MSize var_lookup_(FuncState *fs, GCstr *name, ExpDesc *e, int first)
{
  if (fs) {
    BCReg reg = var_lookup_local(fs, name);
    if ((int32_t)reg >= 0) {  /* Local in this function? */
      expr_init(e, VLOCAL, reg);
      if (!first)
	fscope_uvmark(fs, reg);  /* Scope now has an upvalue. */
      return (MSize)(e->u.s.aux = (uint32_t)fs->varmap[reg]);
    } else {
      MSize vidx = var_lookup_(fs->prev, name, e, 0);  /* Var in outer func? */
      if ((int32_t)vidx >= 0) {  /* Yes, make it an upvalue here. */
	e->u.s.info = (uint8_t)var_lookup_uv(fs, vidx, e);
	e->k = VUPVAL;
	return vidx;
      }
    }
  } else {  /* Not found in any function, must be a global. */
    expr_init(e, VGLOBAL, 0);
    e->u.sval = name;
  }
  return (MSize)-1;  /* Global. */
}